

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_5db41::FileSystemRootNode::is_file(FileSystemRootNode *this,string *path)

{
  int iVar1;
  stat buff;
  stat sStack_98;
  
  iVar1 = stat((path->_M_dataplus)._M_p,&sStack_98);
  return (sStack_98.st_mode & 0xf000) == 0x8000 && iVar1 == 0;
}

Assistant:

inline void aligned_free(void* p) {
#if   defined(GEO_OS_ANDROID)
            // Alignment not supported under Android.
            free(p);
#elif defined(GEO_COMPILER_INTEL)
            _mm_free(p);
#elif defined(GEO_COMPILER_GCC_FAMILY) 
            free(p);
#elif defined(GEO_COMPILER_MSVC)
            _aligned_free(p);
#else
            free(p);
#endif
        }